

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

string * embree::SceneGraph::stringOfType_abi_cxx11_(Type ty)

{
  int in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  string local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [4];
  Tag in_stack_ffffffffffffff9c;
  string local_48 [72];
  
  if (in_ESI == 8) {
    __rhs = &local_88;
    __lhs = in_RDI;
    stringOfTypeTag_abi_cxx11_(in_stack_ffffffffffffff9c);
    std::operator+((char *)__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    stringOfTypeTag_abi_cxx11_(in_stack_ffffffffffffff9c);
    std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  else {
    stringOfTypeTag_abi_cxx11_(in_stack_ffffffffffffff9c);
  }
  return in_RDI;
}

Assistant:

std::string stringOfType(Type ty) {
      if (ty.ty == Type::PTY_LIST) return "list " + stringOfTypeTag(ty.index) + " " + stringOfTypeTag(ty.data);
      else return stringOfTypeTag(ty.ty);
    }